

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_links.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::resolve_links::match_v2
          (resolve_links *this,shared_ptr<const_libtorrent::torrent_info> *ti,string *save_path)

{
  int iVar1;
  element_type *this_00;
  pointer plVar2;
  bool bVar3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar4;
  iterator __it;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  file_index_t index;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  sha256_hash local_50;
  
  this_00 = (ti->super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  iVar4 = file_storage::file_range(&this_00->m_files);
  iVar5 = iVar4;
  while (index.m_val = (int)iVar5._begin.m_val, iVar4._end.m_val.m_val != index.m_val) {
    bVar3 = file_storage::pad_file_at(&this_00->m_files,index);
    if (!bVar3) {
      file_storage::root(&local_50,&this_00->m_files,index);
      __it = ::std::
             _Hashtable<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<256L>_>,_std::hash<libtorrent::digest32<256L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
             ::find(&(this->m_file_roots)._M_h,&local_50);
      if (__it.
          super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar1 = *(int *)((long)__it.
                               super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                               ._M_cur + 0x28);
        plVar2 = (this->m_links).
                 super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                 .
                 super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)&plVar2[iVar1].ti.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
            == 0) {
          ::std::__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)
                     (plVar2 + iVar1),
                     &ti->
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                    );
          ::std::__cxx11::string::_M_assign
                    ((string *)
                     &(this->m_links).
                      super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      .
                      super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar1].save_path);
          (this->m_links).
          super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
          .
          super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar1].file_idx.m_val = index.m_val;
          ::std::
          _Hashtable<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<256L>_>,_std::hash<libtorrent::digest32<256L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::erase(&(this->m_file_roots)._M_h,
                  (const_iterator)
                  __it.
                  super__Node_iterator_base<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                  ._M_cur);
        }
      }
    }
    iVar5._begin.m_val = index.m_val + 1;
    iVar5._end.m_val = 0;
  }
  return;
}

Assistant:

void resolve_links::match_v2(std::shared_ptr<torrent_info const> const& ti
	, std::string const& save_path)
{
	file_storage const& fs = ti->files();
	for (auto const i : fs.file_range())
	{
		// for every file in the other torrent, see if we have one that match
		// it in m_torrent_file
		if (fs.pad_file_at(i)) continue;

		auto const iter = m_file_roots.find(fs.root(i));
		if (iter == m_file_roots.end()) continue;

		auto const idx = iter->second;

		TORRENT_ASSERT(idx >= file_index_t(0));
		TORRENT_ASSERT(idx < m_torrent_file->files().end_file());

		// if we already have found a duplicate for this file, no need
		// to keep looking
		if (m_links[idx].ti) continue;

		m_links[idx].ti = ti;
		m_links[idx].save_path = save_path;
		m_links[idx].file_idx = i;

		// since we have a duplicate for this file, we may as well remove
		// it from the file-size map, so we won't find it again.
		m_file_roots.erase(iter);
	}
}